

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

char * __thiscall CTcTokenizer::store_source_partial(CTcTokenizer *this,char *txt,size_t len)

{
  char *__dest;
  
  __dest = this->src_ptr_;
  memcpy(__dest,txt,len);
  this->src_ptr_ = this->src_ptr_ + len;
  this->src_rem_ = this->src_rem_ - len;
  return __dest;
}

Assistant:

const char *CTcTokenizer::store_source_partial(const char *txt, size_t len)
{
    /* remember where the string starts */
    const char *p = src_ptr_;

    /* store the text */
    memcpy(src_ptr_, txt, len);

    /* advance the source block write position and length */
    src_ptr_ += len;
    src_rem_ -= len;

    /* return the storage pointer */
    return p;
}